

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngerror.c
# Opt level: O0

void png_set_error_fn(png_structrp png_ptr,png_voidp error_ptr,png_error_ptr error_fn,
                     png_error_ptr warning_fn)

{
  png_error_ptr warning_fn_local;
  png_error_ptr error_fn_local;
  png_voidp error_ptr_local;
  png_structrp png_ptr_local;
  
  if (png_ptr != (png_structrp)0x0) {
    png_ptr->error_ptr = error_ptr;
    png_ptr->error_fn = error_fn;
    png_ptr->warning_fn = warning_fn;
  }
  return;
}

Assistant:

void PNGAPI
png_set_error_fn(png_structrp png_ptr, png_voidp error_ptr,
    png_error_ptr error_fn, png_error_ptr warning_fn)
{
   if (png_ptr == NULL)
      return;

   png_ptr->error_ptr = error_ptr;
   png_ptr->error_fn = error_fn;
#ifdef PNG_WARNINGS_SUPPORTED
   png_ptr->warning_fn = warning_fn;
#else
   PNG_UNUSED(warning_fn)
#endif
}